

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hoa.hpp
# Opt level: O1

double __thiscall ear::hoa::norm_N3D(hoa *this,int n,int abs_m)

{
  uint uVar1;
  lanczos17m64 *in_RCX;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  undefined4 in_register_00000014;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  int iVar2;
  longdouble in_ST0;
  longdouble lVar3;
  longdouble lVar4;
  longdouble in_ST1;
  longdouble lVar5;
  double dVar6;
  double dVar7;
  detail local_92;
  undefined1 local_91;
  longdouble local_90;
  longdouble local_80;
  longdouble local_74;
  double local_68;
  double local_60;
  double local_58;
  ulong local_50;
  double local_48;
  double local_40;
  double local_38;
  ulong local_30;
  longdouble local_24;
  
  iVar2 = (int)this;
  uVar1 = iVar2 - n;
  if (uVar1 < 0xab) {
    dVar7 = (double)*(longdouble *)(&DAT_001becf0 + (ulong)uVar1 * 0x10);
    local_48 = dVar7;
  }
  else {
    local_30 = (ulong)(uVar1 + 1);
    boost::math::detail::
    gamma_imp<long_double,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>,boost::math::lanczos::lanczos17m64>
              ((longdouble *)&local_91,&local_92,(longdouble)local_30,
               (policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
                *)CONCAT44(in_register_00000014,abs_m),in_RCX);
    lVar3 = ABS(in_ST0);
    dVar7 = 0.0;
    lVar4 = (longdouble)1.79769313486232e+308;
    abs_m = extraout_EDX;
    in_register_00000014 = extraout_var;
    lVar5 = in_ST0;
    if (lVar4 < lVar3) {
      local_90 = in_ST0;
      local_80 = lVar4;
      local_74 = lVar3;
      boost::math::policies::detail::raise_error<std::overflow_error,double>
                ("boost::math::tgamma<%1%>(%1%)","numeric overflow");
      dVar7 = (double)local_90;
      abs_m = extraout_EDX_00;
      in_register_00000014 = extraout_var_00;
      lVar3 = local_74;
      lVar4 = local_80;
      lVar5 = local_90;
      local_38 = dVar7;
    }
    in_ST0 = in_ST1;
    local_40 = (double)lVar5;
    if (lVar3 <= lVar4) {
      dVar7 = local_40;
    }
    if (dVar7 <= 1.79769313486232e+308) {
      dVar7 = floor(dVar7 + 0.5);
      abs_m = extraout_EDX_01;
      in_register_00000014 = extraout_var_01;
    }
  }
  uVar1 = n + iVar2;
  if (uVar1 < 0xab) {
    dVar6 = (double)*(longdouble *)(&DAT_001becf0 + (ulong)uVar1 * 0x10);
    local_68 = dVar6;
  }
  else {
    local_90 = (longdouble)CONCAT28(local_90._8_2_,dVar7);
    local_50 = (ulong)(uVar1 + 1);
    boost::math::detail::
    gamma_imp<long_double,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>,boost::math::lanczos::lanczos17m64>
              ((longdouble *)&local_91,&local_92,(longdouble)local_50,
               (policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
                *)CONCAT44(in_register_00000014,abs_m),in_RCX);
    lVar3 = ABS(in_ST0);
    dVar6 = 0.0;
    lVar4 = (longdouble)1.79769313486232e+308;
    if (lVar4 < lVar3) {
      local_80 = lVar3;
      local_74 = in_ST0;
      local_24 = lVar4;
      boost::math::policies::detail::raise_error<std::overflow_error,double>
                ("boost::math::tgamma<%1%>(%1%)","numeric overflow");
      dVar6 = (double)local_74;
      lVar3 = local_80;
      lVar4 = local_24;
      in_ST0 = local_74;
      local_58 = dVar6;
    }
    local_60 = (double)in_ST0;
    if (lVar3 <= lVar4) {
      dVar6 = local_60;
    }
    if (dVar6 <= 1.79769313486232e+308) {
      dVar6 = floor(dVar6 + 0.5);
    }
    dVar7 = local_90._0_8_;
  }
  dVar6 = (((double)iVar2 + (double)iVar2 + 1.0) * dVar7) / dVar6;
  if (dVar6 < 0.0) {
    dVar6 = sqrt(dVar6);
  }
  else {
    dVar6 = SQRT(dVar6);
  }
  return dVar6;
}

Assistant:

inline double norm_N3D(int n, int abs_m) {
      return std::sqrt((2.0 * n + 1.0) *
                       boost::math::factorial<double>(n - abs_m) /
                       boost::math::factorial<double>(n + abs_m));
    }